

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::ColumnChunk::ColumnChunk(ColumnChunk *this)

{
  ColumnMetaData *in_RDI;
  
  duckdb_apache::thrift::TBase::TBase((TBase *)in_RDI);
  *(undefined ***)in_RDI = &PTR__ColumnChunk_03540ba0;
  *(undefined ***)in_RDI = &PTR__ColumnChunk_03540ba0;
  std::__cxx11::string::string((string *)&in_RDI->type);
  (in_RDI->path_in_schema).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ColumnMetaData::ColumnMetaData(in_RDI);
  in_RDI[1].path_in_schema.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined4 *)
   &in_RDI[1].path_in_schema.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined8 *)&in_RDI[1].codec = 0;
  *(undefined4 *)&in_RDI[1].num_values = 0;
  ColumnCryptoMetaData::ColumnCryptoMetaData((ColumnCryptoMetaData *)in_RDI);
  std::__cxx11::string::string((string *)(in_RDI[1].statistics.max.field_2._M_local_buf + 8));
  _ColumnChunk__isset::_ColumnChunk__isset
            ((_ColumnChunk__isset *)(in_RDI[1].statistics.min.field_2._M_local_buf + 8));
  return;
}

Assistant:

ColumnChunk::ColumnChunk() noexcept
   : file_path(),
     file_offset(0LL),
     offset_index_offset(0),
     offset_index_length(0),
     column_index_offset(0),
     column_index_length(0),
     encrypted_column_metadata() {
}